

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

BaseFab<double> * __thiscall
amrex::BaseFab<double>::copy<(amrex::RunOn)1>
          (BaseFab<double> *this,BaseFab<double> *src,Box bx,SrcComp scomp,DestComp dcomp,
          NumComps ncomp)

{
  undefined4 in_EDX;
  long in_RSI;
  BaseFab<double> *in_RDI;
  Array4<const_double> *s;
  Array4<double> *d;
  undefined1 local_340 [32];
  anon_class_144_4_062952f7 *in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffcec;
  Box *in_stack_fffffffffffffcf0;
  undefined1 auStack_2f8 [64];
  undefined4 local_2b8;
  undefined4 local_2ac;
  Array4<const_double> local_2a8;
  Array4<const_double> *local_268;
  Array4<double> local_260;
  Array4<double> *local_220;
  long local_218;
  undefined4 local_1fc;
  undefined4 *local_1f0;
  Dim3 local_1e8;
  Dim3 local_1d8;
  Dim3 local_1c8;
  Dim3 local_1b8;
  int local_1ac;
  Box *local_1a8;
  double *local_1a0;
  Dim3 local_198;
  Box *local_188;
  int local_180;
  int iStack_17c;
  int local_178;
  undefined4 local_174;
  Box *local_170;
  undefined4 local_164;
  Box *local_160;
  undefined4 local_154;
  Box *local_150;
  Dim3 local_148;
  Box *local_138;
  int local_130;
  int iStack_12c;
  int local_128;
  undefined4 local_124;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  long local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  double *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_218 = in_RSI;
  local_1fc = in_EDX;
  Box::operator&=((Box *)&stack0x00000008,(Box *)(in_RSI + 0x18));
  local_1a0 = in_RDI->dptr;
  local_1a8 = &in_RDI->domain;
  local_1ac = in_RDI->nvar;
  local_154 = 0;
  local_180 = (local_1a8->smallend).vect[0];
  local_164 = 1;
  iStack_17c = (in_RDI->domain).smallend.vect[1];
  local_1c8.x = (local_1a8->smallend).vect[0];
  local_1c8.y = (local_1a8->smallend).vect[1];
  local_174 = 2;
  local_1c8.z = (in_RDI->domain).smallend.vect[2];
  local_100 = &(in_RDI->domain).bigend;
  local_104 = 0;
  local_130 = local_100->vect[0] + 1;
  local_110 = &(in_RDI->domain).bigend;
  local_114 = 1;
  iStack_12c = (in_RDI->domain).bigend.vect[1] + 1;
  local_120 = &(in_RDI->domain).bigend;
  local_124 = 2;
  local_1e8.z = (in_RDI->domain).bigend.vect[2] + 1;
  local_1e8.y = iStack_12c;
  local_1e8.x = local_130;
  local_1d8._0_8_ = local_1e8._0_8_;
  local_1d8.z = local_1e8.z;
  local_1b8._0_8_ = local_1c8._0_8_;
  local_1b8.z = local_1c8.z;
  local_198._0_8_ = local_1c8._0_8_;
  local_198.z = local_1c8.z;
  local_188 = local_1a8;
  local_178 = local_1c8.z;
  local_170 = local_1a8;
  local_160 = local_1a8;
  local_150 = local_1a8;
  local_148._0_8_ = local_1e8._0_8_;
  local_148.z = local_1e8.z;
  local_138 = local_1a8;
  local_128 = local_1e8.z;
  Array4<double>::Array4(&local_260,local_1a0,&local_1b8,&local_1d8,local_1ac);
  local_f8 = local_218;
  local_a8 = *(double **)(local_218 + 0x10);
  local_b0 = (undefined8 *)(local_218 + 0x18);
  local_b4 = *(int *)(local_218 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_218 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(local_218 + 0x20);
  local_8 = (int *)(local_218 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_218 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_218 + 0x28) + 1;
  local_28 = local_218 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(local_218 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_220 = &local_260;
  local_dc._0_8_ = local_f0._0_8_;
  local_dc.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_double>::Array4(&local_2a8,local_a8,&local_c0,&local_dc,local_b4);
  local_268 = &local_2a8;
  local_2ac = 1;
  local_1f0 = &local_2ac;
  memcpy(local_340,local_220,0x3c);
  memcpy(auStack_2f8,local_268,0x3c);
  local_2b8 = local_1fc;
  LoopConcurrentOnCpu<amrex::BaseFab<double>::copy<(amrex::RunOn)1>(amrex::BaseFab<double>const&,amrex::Box,amrex::SrcComp,amrex::DestComp,amrex::NumComps)::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec,in_stack_fffffffffffffce0);
  return in_RDI;
}

Assistant:

BaseFab<T>&
BaseFab<T>::copy (const BaseFab<T>& src, Box bx,
                  SrcComp scomp, DestComp dcomp, NumComps ncomp) noexcept
{
    AMREX_ASSERT(this->domain.sameType(src.domain));
    AMREX_ASSERT(scomp.i >= 0 && scomp.i+ncomp.n <= src.nvar);
    AMREX_ASSERT(dcomp.i >= 0 && dcomp.i+ncomp.n <= this->nvar);

    bx &= src.domain;

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, bx, ncomp.n, i, j, k, n,
    {
        d(i,j,k,n+dcomp.i) = s(i,j,k,n+scomp.i);
    });

    return *this;
}